

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9ReadStg(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint kHot;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint fVerbose;
  int iVar3;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  kHot = 1;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Kvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (argc - globalUtilOptind == 1) {
        pcVar2 = argv[globalUtilOptind];
        __stream = fopen(pcVar2,"r");
        if (__stream == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar2);
          return 1;
        }
        fclose(__stream);
        pNew = Gia_ManStgRead(pcVar2,kHot,fVerbose);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      pcVar2 = "There is no file name.\n";
      iVar3 = -1;
      goto LAB_00225a64;
    }
    if (iVar1 != 0x4b) goto LAB_002259e3;
    if (argc <= globalUtilOptind) break;
    kHot = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if (kHot - 6 < 0xfffffffb) {
LAB_002259e3:
      Abc_Print(-2,"usage: &read_stg [-K <num>] [-vh] <file>\n");
      Abc_Print(-2,"\t         reads STG file and generates K-hot-encoded AIG\n");
      Abc_Print(-2,
                "\t-K num : the K parameter for hotness of the encoding (1 <= K <= 5) [default = %d]\n"
                ,(ulong)kHot);
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing state codes [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar2 = "\t<file> : the file name\n";
      iVar3 = -2;
LAB_00225a64:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
  goto LAB_002259e3;
}

Assistant:

int Abc_CommandAbc9ReadStg( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pAig;
    FILE * pFile;
    char * FileName, ** pArgvNew;
    int c, nArgcNew;
    int kHot = 1;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            kHot = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( kHot < 1 || kHot > 5 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        return 1;
    }
    fclose( pFile );

    pAig = Gia_ManStgRead( FileName, kHot, fVerbose );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_stg [-K <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t         reads STG file and generates K-hot-encoded AIG\n" );
    Abc_Print( -2, "\t-K num : the K parameter for hotness of the encoding (1 <= K <= 5) [default = %d]\n", kHot );
    Abc_Print( -2, "\t-v     : toggles printing state codes [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}